

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_read_unknown(void)

{
  _Bool _Var1;
  char *what;
  borg_item_conflict *item;
  int local_10;
  int n;
  int i;
  
  item._4_4_ = -1;
  for (local_10 = 0; local_10 < (int)(uint)z_info->pack_size; local_10 = local_10 + 1) {
    if (((borg_items[local_10].iqty != '\0') && (borg_items[local_10].tval == '\x19')) &&
       ((borg_items[local_10].aware & 1U) == 0)) {
      item._4_4_ = local_10;
    }
  }
  if (item._4_4_ < 0) {
    n._3_1_ = false;
  }
  else {
    _Var1 = no_light(player);
    if (_Var1) {
      n._3_1_ = false;
    }
    else if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
      what = format("# Reading unknown scroll %s.",borg_items + item._4_4_);
      borg_note(what);
      borg_keypress(0x72);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[item._4_4_]);
      borg_keypress(0xe000);
      borg.goal.item = -1;
      borg.goal.ware = -1;
      borg.goal.shop = -1;
      n._3_1_ = true;
    }
    else {
      n._3_1_ = false;
    }
  }
  return n._3_1_;
}

Assistant:

bool borg_read_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_SCROLL)
            continue;

        /* Skip aware items */
        if (item->aware)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return false;

    /* Dark */
    if (no_light(player))
        return false;

    /* Blind or Confused */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return false;

    /* Log the message */
    borg_note(format("# Reading unknown scroll %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('r');
    borg_keypress(all_letters_nohjkl[n]);

    /* Incase it is ID scroll, ESCAPE out. */
    borg_keypress(ESCAPE);

    /* Hack -- Clear "shop" goals */
    borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

    /* Success */
    return true;
}